

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O2

wchar_t borg_calculate_defense_effectiveness(wchar_t what,wchar_t p1)

{
  undefined4 uVar1;
  loc_conflict grid1;
  loc_conflict grid1_00;
  loc_conflict grid1_01;
  loc_conflict grid1_02;
  loc_conflict grid2;
  loc_conflict grid1_03;
  loc_conflict grid1_04;
  loc_conflict grid1_05;
  loc_conflict grid1_06;
  loc_conflict grid1_07;
  keycode_t k;
  bool bVar2;
  monster_race *pmVar3;
  borg_kill *pbVar4;
  borg_item_conflict *pbVar5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  char cVar10;
  int16_t iVar11;
  ushort uVar12;
  int iVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  uint uVar16;
  uint uVar17;
  wchar_t wVar18;
  wchar_t wVar19;
  int iVar20;
  wchar_t wVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  int *piVar25;
  wchar_t *pwVar26;
  char cVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  byte bVar33;
  int iVar34;
  ulong uVar35;
  char *fmt;
  loc_conflict t;
  ushort uVar36;
  char cVar37;
  ulong uVar38;
  borg_grid *pbVar39;
  long lVar40;
  long lVar41;
  wchar_t i;
  bool bVar42;
  ulong local_c60;
  uint local_c58;
  int local_c50;
  int local_c3c;
  wchar_t awStack_c38 [256];
  wchar_t b_kill_count [255];
  wchar_t b_danger [255];
  
  iVar13 = borg.c.y;
  iVar34 = borg.c.x;
  wVar15 = L'\x0f';
  wVar21 = L'\x06';
  wVar14 = L'\x05';
  uVar28 = 6;
  wVar18 = L'\x01';
  wVar19 = L'#';
  switch(what) {
  case L'\0':
    if ((((!borg.temp.bless) && (borg.trait[0x70] == 0)) &&
        ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) &&
       (((borg_grids[borg.c.y][borg.c.x].info & 2) != 0 || (borg.trait[0x1a] != 0)))) {
      _Var6 = borg_spell_okay_fail(BLESS,L'\x19');
      if ((!_Var6) &&
         (((((_Var6 = borg_equips_item(act_blessing,true), !_Var6 &&
             (_Var6 = borg_equips_item(act_blessing2,true), !_Var6)) &&
            (_Var6 = borg_equips_item(act_blessing3,true), !_Var6)) &&
           ((wVar15 = borg_slot(L'\x19',sv_scroll_blessing), wVar15 == L'\xffffffff' &&
            (wVar15 = borg_slot(L'\x19',sv_scroll_holy_chant), wVar15 == L'\xffffffff')))) &&
          (wVar15 = borg_slot(L'\x19',sv_scroll_holy_prayer), wVar15 == L'\xffffffff')))) {
        return L'\0';
      }
      lVar41 = 0x1d8;
      bVar33 = 0;
      iVar11 = borg_kills_nxt;
      for (lVar40 = 1; lVar40 < iVar11; lVar40 = lVar40 + 1) {
        if ((*(short *)(borg_kills->spell + lVar41 + -0x19) != 0) &&
           (borg_t + -5 <= (int)*(short *)((long)&borg_kills->when + lVar41))) {
          grid1.y = borg.c.y;
          grid1.x = borg.c.x;
          wVar15 = distance(grid1,*(loc_conflict *)(borg_kills->spell + lVar41 + -0xd));
          bVar33 = bVar33 | wVar15 < L'\x04';
          iVar11 = borg_kills_nxt;
        }
        lVar41 = lVar41 + 0x1d8;
      }
      if (avoidance / 0xc < p1) {
        bVar42 = L'\0' < p1;
      }
      else {
        bVar42 = L'\0' < p1 && borg.trait[0x23] < 0x10;
      }
      if (((bool)(bVar42 & bVar33)) && (p1 < avoidance / 2)) {
        if (borg_simulate != false) {
          return L'\x01';
        }
        borg_note("# Attempting to cast Bless");
        borg.no_rest_prep = 11000;
        _Var6 = borg_spell(BLESS);
        if (_Var6) {
          return L'\x01';
        }
        _Var6 = borg_activate_item(act_blessing);
        if (_Var6) {
          return L'\x01';
        }
        _Var6 = borg_activate_item(act_blessing2);
        if (_Var6) {
          return L'\x01';
        }
        _Var6 = borg_activate_item(act_blessing3);
        if (_Var6) {
          return L'\x01';
        }
        _Var6 = borg_read_scroll(sv_scroll_blessing);
        if (_Var6) {
          return L'\x01';
        }
        _Var6 = borg_read_scroll(sv_scroll_holy_chant);
        if (_Var6) {
          return L'\x01';
        }
        _Var6 = borg_read_scroll(sv_scroll_holy_prayer);
        goto LAB_00200938;
      }
    }
    break;
  case L'\x01':
    if (((!borg.temp.fast) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x0f';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(HASTE_SELF,wVar15);
      _Var7 = borg_equips_staff_fail(sv_staff_speed);
      _Var8 = borg_equips_rod(sv_rod_speed);
      wVar21 = borg_slot(L'\x1a',sv_potion_speed);
      if ((((wVar21 < L'\0') && (!_Var7)) &&
          ((!_Var8 &&
           (((!_Var6 && (_Var9 = borg_equips_item(act_haste,true), !_Var9)) &&
            (_Var9 = borg_equips_item(act_haste1,true), !_Var9)))))) &&
         (_Var9 = borg_equips_item(act_haste2,true), !_Var9)) {
        return L'\0';
      }
      if ((((_Var8 || _Var6) || _Var7) || (_Var6 = borg_equips_item(act_haste,true), _Var6)) ||
         ((_Var6 = borg_equips_item(act_haste1,true), _Var6 ||
          (_Var6 = borg_equips_item(act_haste2,true), _Var6)))) {
        bVar42 = true;
      }
      else {
        bVar42 = false;
      }
      borg.temp.fast = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      wVar21 = borg_fighting_unique;
      borg.temp.fast = false;
      if (scaryguy_on_level == true) {
        wVar18 = (wVar18 * 3) / 10;
      }
      if ((bool)(borg_fighting_unique != L'\0' & bVar42)) {
        wVar18 = (wVar18 * 7) / 10;
      }
      if ((borg_fighting_unique != L'\0' & borg_fighting_summoner) == 1) {
        wVar18 = (wVar18 * 7) / 10;
      }
      iVar34 = borg.trait[0x69];
      if (borg_fighting_unique < L'\n' || iVar34 != 99) {
        if (borg_fighting_unique == L'\0') {
          bVar2 = true;
          goto LAB_00203077;
        }
      }
      else {
        wVar18 = (wVar18 * 6) / 10;
      }
      pcVar23 = r_info[unique_on_level].name;
      iVar13 = strcmp(pcVar23,"Bullroarer the Hobbit");
      if (((iVar13 == 0) || (iVar13 = strcmp(pcVar23,"Mughash the Kobold Lord"), iVar13 == 0)) ||
         ((iVar13 = strcmp(pcVar23,"Wormtongue, Agent of Saruman"), iVar13 == 0 ||
          (((iVar13 = strcmp(pcVar23,"Lagduf, the Snaga"), iVar13 == 0 ||
            (iVar13 = strcmp(pcVar23,"Brodda, the Easterling"), iVar13 == 0)) ||
           (iVar13 = strcmp(pcVar23,"Orfax, Son of Boldor"), iVar13 == 0)))))) {
        wVar18 = (wVar18 * 6) / 10;
        bVar2 = false;
      }
      else {
        bVar2 = false;
      }
LAB_00203077:
      wVar19 = wVar18 / 2;
      if (wVar21 < L'\n') {
        wVar19 = wVar18;
      }
      if (iVar34 != 100) {
        wVar19 = wVar18;
      }
      wVar18 = L'✏';
      if (wVar21 != L'\0') {
        wVar18 = wVar19;
      }
      if (iVar34 < 0x61) {
        wVar18 = wVar19;
      }
      if (bVar42) {
        wVar18 = wVar19;
      }
      wVar21 = p1 - wVar18;
      if (wVar21 == L'\0' || p1 < wVar18) {
        return L'\0';
      }
      if (bVar2) {
        wVar19 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar19 = (avoidance * 2) / 3;
      }
      if ((wVar19 < wVar18) || (!(bool)(bVar42 & avoidance / 5 < p1))) {
        if (bVar2) {
          wVar19 = (wchar_t)(avoidance / 3);
        }
        else {
          wVar19 = (avoidance * 2) / 3;
        }
        if (wVar19 < wVar18) {
          return L'\0';
        }
        if (p1 <= avoidance / 7) {
          return L'\0';
        }
      }
      if (borg_simulate == true) {
        return wVar21;
      }
      borg_note("# Attempting to cast Speed");
      borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
      _Var6 = borg_zap_rod(sv_rod_speed);
      if (_Var6) {
        return wVar21;
      }
      _Var6 = borg_activate_item(act_haste);
      if (_Var6) {
        return wVar21;
      }
      _Var6 = borg_activate_item(act_haste1);
      if (_Var6) {
        return wVar21;
      }
      _Var6 = borg_activate_item(act_haste2);
      if (_Var6) {
        return wVar21;
      }
      _Var6 = borg_use_staff(sv_staff_speed);
      if (!_Var6) {
        _Var6 = borg_quaff_potion(sv_potion_speed);
        if (_Var6) {
          return wVar21;
        }
        _Var6 = borg_spell_fail(HASTE_SELF,wVar15);
        if (_Var6) {
          return wVar21;
        }
        return L'\0';
      }
      return wVar21;
    }
    break;
  case L'\x02':
    iVar34 = borg.trait[0x4e];
    iVar13 = borg.trait[0x56];
    if ((((iVar34 == 0 || iVar13 == 0) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x0f';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(GRIM_PURPOSE,wVar15);
      if (!_Var6) {
        return L'\0';
      }
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      piVar25 = borg.trait;
      borg.trait[0x4e] = 1;
      piVar25[0x56] = 1;
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      piVar25 = borg.trait;
      borg.trait[0x4e] = (uint)(iVar34 != 0);
      piVar25[0x56] = (uint)(iVar13 != 0);
      if (wVar15 - wVar21 == 0 || wVar15 < wVar21) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar18 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar18 = (avoidance * 2) / 3;
      }
      if (wVar21 <= wVar18) {
        if (avoidance / 7 < wVar15) {
          if (borg_simulate != true) {
            borg_note("# Attempting to cast Grim Purpose");
            _Var6 = borg_spell(GRIM_PURPOSE);
            if (_Var6) {
              borg.no_rest_prep = 13000;
            }
          }
          return (wVar15 - wVar21) + L'\x02';
        }
        return L'\0';
      }
      return L'\0';
    }
    break;
  case L'\x03':
    if ((((borg.temp.res_fire != true) || (borg.temp.res_acid != true)) ||
        ((!borg.temp.res_pois || ((borg.temp.res_elec != true || (borg.temp.res_cold == false))))))
       && ((borg.trait[0x70] == 0 && ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))))) {
      _Var6 = borg_equips_item(act_resist_all,true);
      if ((!_Var6) && (_Var6 = borg_equips_item(act_rage_bless_resist,true), !_Var6)) {
        return L'\0';
      }
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var6 = borg.temp.res_pois;
      uVar1 = borg.temp._4_4_;
      borg.temp.res_pois = true;
      borg.temp.res_fire = true;
      borg.temp.res_cold = true;
      borg.temp.res_acid = true;
      borg.temp.res_elec = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar15 = borg_fighting_unique;
      borg.temp._4_4_ = uVar1;
      borg.temp.res_pois = _Var6;
      if ((borg_fighting_unique != L'\0') &&
         (iVar34 = strcmp(r_info[unique_on_level].name,"The Tarrasque"), iVar34 == 0)) {
        wVar18 = (wVar18 << 3) / 10;
      }
      if (0x2c < borg.trait[0x23]) {
        wVar18 = (wVar18 << 3) / 10;
      }
      if (wVar21 - wVar18 != 0 && wVar18 <= wVar21) {
        if (wVar15 == L'\0') {
          wVar15 = (wchar_t)(avoidance / 2);
        }
        else {
          wVar15 = (avoidance * 2) / 3;
        }
        if (wVar18 <= wVar15) {
          if (avoidance / 7 < wVar21) {
            if (borg_simulate != true) {
              borg_note("# Attempting to cast FECAP");
              _Var6 = borg_activate_item(act_resist_all);
              if ((_Var6) || (_Var6 = borg_activate_item(act_rage_bless_resist), _Var6)) {
                borg.no_rest_prep = 21000;
              }
            }
            return (wVar21 - wVar18) + L'\x02';
          }
          return L'\0';
        }
        return L'\0';
      }
      return L'\0';
    }
    break;
  case L'\x04':
    if ((((borg.temp.res_fire == false) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x0f';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if (((((!_Var6) && (_Var6 = borg_equips_item(act_resist_all,true), !_Var6)) &&
           ((_Var6 = borg_equips_item(act_resist_fire,true), !_Var6 &&
            ((_Var6 = borg_equips_item(act_rage_bless_resist,true), !_Var6 &&
             (_Var6 = borg_equips_ring(sv_ring_flames), !_Var6)))))) &&
          (_Var6 = borg_equips_item(act_ring_flames,true), !_Var6)) &&
         (wVar21 = borg_slot(L'\x1a',sv_potion_resist_heat), wVar21 == L'\xffffffff')) {
        return L'\0';
      }
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp.res_fire = true;
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_4_ = (uint)(uint3)borg.temp._5_3_ << 8;
      if (borg_fighting_unique == L'\0') {
        if (wVar18 <= wVar21) {
          return L'\0';
        }
        uVar28 = (uint)(ushort)avoidance;
        wVar19 = (wchar_t)(avoidance / 2);
      }
      else {
        iVar34 = strcmp(r_info[unique_on_level].name,"The Tarrasque");
        if (iVar34 == 0) {
          wVar21 = (wVar21 << 3) / 10;
        }
        if (wVar18 <= wVar21) break;
        uVar28 = (uint)avoidance;
        wVar19 = (int)(uVar28 * 2) / 3;
      }
      if (wVar19 < wVar21) {
        return L'\0';
      }
      if (wVar18 <= (short)((int)((uint)(ushort)((short)uVar28 >> 0xf) << 0x10 | uVar28 & 0xffff) /
                           7)) {
        return L'\0';
      }
      if (borg_simulate == true) goto LAB_00204205;
      borg_note("# Attempting to cast RFire");
      _Var6 = borg_activate_ring(sv_ring_flames);
      if ((_Var6) || (_Var6 = borg_activate_item(act_ring_flames), _Var6)) {
LAB_002032be:
        borg_keypress(0x2a);
        borg_keypress(0x35);
        goto LAB_00204205;
      }
      _Var6 = borg_activate_item(act_resist_all);
      if ((((!_Var6) && (_Var6 = borg_activate_item(act_resist_fire), !_Var6)) &&
          (_Var6 = borg_activate_item(act_rage_bless_resist), !_Var6)) &&
         (_Var6 = borg_spell_fail(RESISTANCE,wVar15), !_Var6)) {
        pwVar26 = &sv_potion_resist_heat;
LAB_002041f3:
        _Var6 = borg_quaff_potion(*pwVar26);
        if (!_Var6) goto LAB_00204205;
      }
LAB_002041fe:
      borg.no_rest_prep = 21000;
LAB_00204205:
      return wVar18 - wVar21;
    }
    break;
  case L'\x05':
    if (((borg.temp.res_cold == false) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x0f';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if (((!_Var6) && (_Var6 = borg_equips_item(act_resist_all,true), !_Var6)) &&
         ((_Var6 = borg_equips_item(act_rage_bless_resist,true), !_Var6 &&
          ((((_Var6 = borg_equips_item(act_resist_cold,true), !_Var6 &&
             (_Var6 = borg_equips_ring(sv_ring_ice), !_Var6)) &&
            (_Var6 = borg_equips_item(act_ring_ice,true), !_Var6)) &&
           (wVar21 = borg_slot(L'\x1a',sv_potion_resist_cold), wVar21 == L'\xffffffff')))))) {
        return L'\0';
      }
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var6 = borg.temp.res_cold;
      borg.temp.res_cold = true;
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_2_ = CONCAT11(_Var6,borg.temp.res_fire);
      if (borg_fighting_unique == L'\0') {
        if (wVar18 <= wVar21) {
          return L'\0';
        }
        uVar28 = (uint)(ushort)avoidance;
        wVar19 = (wchar_t)(avoidance / 2);
      }
      else {
        iVar34 = strcmp(r_info[unique_on_level].name,"The Tarrasque");
        if (iVar34 == 0) {
          wVar21 = (wVar21 << 3) / 10;
        }
        if (wVar18 <= wVar21) break;
        uVar28 = (uint)avoidance;
        wVar19 = (int)(uVar28 * 2) / 3;
      }
      if (wVar19 < wVar21) {
        return L'\0';
      }
      if (wVar18 <= (short)((int)((uint)(ushort)((short)uVar28 >> 0xf) << 0x10 | uVar28 & 0xffff) /
                           7)) {
        return L'\0';
      }
      if (borg_simulate == true) goto LAB_00204205;
      borg_note("# Attempting to cast RCold");
      _Var6 = borg_activate_ring(sv_ring_ice);
      if ((_Var6) || (_Var6 = borg_activate_item(act_ring_ice), _Var6)) goto LAB_002032be;
      _Var6 = borg_activate_item(act_resist_all);
      if (((!_Var6) &&
          ((_Var6 = borg_activate_item(act_rage_bless_resist), !_Var6 &&
           (_Var6 = borg_activate_item(act_resist_cold), !_Var6)))) &&
         (_Var6 = borg_spell_fail(RESISTANCE,wVar15), !_Var6)) {
        pwVar26 = &sv_potion_resist_cold;
        goto LAB_002041f3;
      }
      goto LAB_002041fe;
    }
    break;
  case L'\x06':
    if ((((borg.temp.res_acid == false) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x0f';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if (((!_Var6) && (_Var6 = borg_equips_item(act_resist_acid,true), !_Var6)) &&
         ((_Var6 = borg_equips_item(act_resist_all,true), !_Var6 &&
          ((_Var6 = borg_equips_item(act_rage_bless_resist,true), !_Var6 &&
           (_Var6 = borg_equips_ring(sv_ring_acid), !_Var6)))))) {
        return L'\0';
      }
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var6 = borg.temp.res_acid;
      borg.temp.res_acid = true;
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_3_ = CONCAT12(_Var6,borg.temp._4_2_);
      wVar18 = wVar15 - wVar21;
      if (wVar18 == L'\0' || wVar15 < wVar21) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar19 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar19 = (avoidance * 2) / 3;
      }
      if (wVar19 < wVar21) {
        return L'\0';
      }
      if (wVar15 <= avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar18;
      }
      borg_note("# Attempting to cast RAcid");
      _Var6 = borg_spell(RESISTANCE);
      if (_Var6) {
        return wVar18;
      }
      _Var6 = borg_activate_ring(sv_ring_acid);
      if ((!_Var6) && (_Var6 = borg_activate_item(act_ring_acid), !_Var6)) {
        piVar25 = &act_resist_acid;
LAB_00204272:
        _Var6 = borg_activate_item(*piVar25);
        if (((!_Var6) && (_Var6 = borg_activate_item(act_resist_all), !_Var6)) &&
           (_Var6 = borg_activate_item(act_rage_bless_resist), !_Var6)) {
          return wVar18;
        }
        borg.no_rest_prep = 21000;
        return wVar18;
      }
LAB_0020391c:
      borg_keypress(0x2a);
      borg_keypress(0x35);
      return wVar18;
    }
    break;
  case L'\a':
    if (((borg.temp.res_elec == false) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x0f';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(RESISTANCE,wVar15);
      if (((((!_Var6) && (_Var6 = borg_equips_item(act_resist_elec,true), !_Var6)) &&
           (_Var6 = borg_equips_item(act_resist_all,true), !_Var6)) &&
          ((_Var6 = borg_equips_item(act_rage_bless_resist,true), !_Var6 &&
           (_Var6 = borg_equips_ring(sv_ring_lightning), !_Var6)))) &&
         (_Var6 = borg_equips_item(act_ring_lightning,true), !_Var6)) {
        return L'\0';
      }
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var6 = borg.temp.res_elec;
      borg.temp.res_elec = true;
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp._4_4_ = CONCAT13(_Var6,borg.temp._4_3_);
      wVar18 = wVar15 - wVar21;
      if (wVar18 == L'\0' || wVar15 < wVar21) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar19 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar19 = (avoidance * 2) / 3;
      }
      if (wVar19 < wVar21) {
        return L'\0';
      }
      if (wVar15 <= avoidance / 7) {
        return L'\0';
      }
      if (borg_simulate == true) {
        return wVar18;
      }
      borg_note("# Attempting to cast RAcid");
      _Var6 = borg_spell(RESISTANCE);
      if (_Var6) {
        return wVar18;
      }
      _Var6 = borg_activate_ring(sv_ring_lightning);
      if ((!_Var6) && (_Var6 = borg_activate_item(act_ring_lightning), !_Var6)) {
        piVar25 = &act_resist_elec;
        goto LAB_00204272;
      }
      goto LAB_0020391c;
    }
    break;
  case L'\b':
    if (((!borg.temp.res_pois) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x0f';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(RESIST_POISON,wVar15);
      if (((!_Var6) && (_Var6 = borg_equips_item(act_resist_pois,true), !_Var6)) &&
         ((_Var6 = borg_equips_item(act_resist_all,true), !_Var6 &&
          ((_Var6 = borg_equips_item(act_rage_bless_resist,true), !_Var6 &&
           (wVar21 = borg_slot(L'\x1a',sv_potion_resist_pois), wVar21 == L'\xffffffff')))))) {
        return L'\0';
      }
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      _Var6 = borg.temp.res_pois;
      borg.temp.res_pois = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      wVar19 = wVar21 - wVar18;
      if (wVar19 == L'\0' || wVar21 < wVar18) {
        borg.temp.res_pois = _Var6;
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar14 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar14 = (avoidance * 2) / 3;
      }
      if (wVar18 <= wVar14) {
        if (wVar21 <= avoidance / 7) {
          borg.temp.res_pois = _Var6;
          return L'\0';
        }
        if (borg_simulate != true) {
          borg.temp.res_pois = _Var6;
          borg_note("# Attempting to cast RPois");
          _Var6 = borg_spell_fail(RESIST_POISON,wVar15);
          if ((((!_Var6) && (_Var6 = borg_activate_item(act_resist_pois), !_Var6)) &&
              (_Var6 = borg_activate_item(act_resist_all), !_Var6)) &&
             ((_Var6 = borg_activate_item(act_rage_bless_resist), !_Var6 &&
              (_Var6 = borg_quaff_potion(sv_potion_resist_pois), !_Var6)))) {
            return wVar19;
          }
          borg.no_rest_prep = 21000;
          return wVar19;
        }
        borg.temp.res_pois = _Var6;
        return wVar19;
      }
      borg.temp.res_pois = _Var6;
      return L'\0';
    }
    break;
  case L'\t':
    if ((((!borg.temp.prot_from_evil) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      pbVar39 = borg_grids[borg.c.y];
      lVar40 = (long)borg.c.x;
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x14';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = wVar19;
        }
      }
      _Var6 = borg_spell_okay_fail(PROTECTION_FROM_EVIL,wVar15);
      wVar21 = borg_slot(L'\x19',sv_scroll_protection_from_evil);
      if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
        bVar42 = L'\xffffffff' < wVar21 || _Var6;
      }
      else {
        bVar42 = false;
      }
      if (((pbVar39[lVar40].info & 2) == 0) && (borg.trait[0x1a] == 0)) {
        bVar42 = false;
      }
      _Var6 = borg_equips_item(act_protevil,true);
      if ((!_Var6) && (!bVar42)) {
        return L'\0';
      }
      wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp.prot_from_evil = true;
      wVar18 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
      borg.temp.prot_from_evil = false;
      wVar19 = wVar21 - wVar18;
      if (wVar19 != L'\0' && wVar18 <= wVar21) {
        if (borg_fighting_unique == L'\0') {
          wVar14 = (wchar_t)(avoidance / 2);
        }
        else {
          wVar14 = (avoidance * 2) / 3;
        }
        if ((wVar18 <= wVar14) && (avoidance / 7 < wVar21)) goto LAB_00203bb7;
      }
      if (borg_cfg[0x18] < 1) {
        borg.temp.prot_from_evil = false;
        return L'\0';
      }
      if (borg.trait[0x69] != 0) {
        borg.temp.prot_from_evil = false;
        return L'\0';
      }
LAB_00203bb7:
      if (borg_simulate == true) {
        borg.temp.prot_from_evil = false;
        return wVar19;
      }
      borg_note("# Attempting to cast PFE");
      _Var6 = borg_spell_fail(PROTECTION_FROM_EVIL,wVar15);
      if (((!_Var6) && (_Var6 = borg_activate_item(act_protevil), !_Var6)) &&
         (_Var6 = borg_read_scroll(sv_scroll_protection_from_evil), !_Var6)) {
        return wVar19;
      }
      borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
      return wVar19;
    }
    break;
  case L'\n':
    if (((!borg.temp.shield) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) {
      if ((borg.has[kv_mush_stoneskin] < 1) &&
         (_Var6 = borg_equips_item(act_shroom_stone,true), !_Var6)) {
        return L'\0';
      }
      borg.temp.shield = true;
      wVar15 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      borg.temp.shield = false;
      if (borg_fighting_unique == L'\0') {
        if (p1 <= wVar15) {
          borg.temp.shield = false;
          return L'\0';
        }
        uVar28 = (uint)(ushort)avoidance;
        wVar21 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar15 = (wVar15 * 7) / 10;
        if (p1 <= wVar15) {
          borg.temp.shield = false;
          return L'\0';
        }
        uVar28 = (uint)avoidance;
        wVar21 = (int)(uVar28 * 2) / 3;
      }
      if (wVar15 <= wVar21) {
        if (p1 <= (short)((int)((uint)(ushort)((short)uVar28 >> 0xf) << 0x10 | uVar28 & 0xffff) / 7)
           ) {
          borg.temp.shield = false;
          return L'\0';
        }
        if (borg_simulate != true) {
          borg_note("# Attempting to eat a stone skin");
          _Var6 = borg_eat(L'\x1d',sv_mush_stoneskin);
          if ((!_Var6) && (_Var6 = borg_activate_item(act_shroom_stone), !_Var6)) {
            return L'\0';
          }
          borg.no_rest_prep = 2000;
        }
        return p1 - wVar15;
      }
      borg.temp.shield = false;
      return L'\0';
    }
    break;
  case L'\v':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      iVar34 = (int)avoidance;
      if (borg_fighting_unique == L'\0') {
        wVar15 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar15 = (iVar34 * 7) / 10;
      }
      if ((((wVar15 <= p1) || (borg.trait[0x1e] < 0x1f)) || (!borg_simulate)) &&
         (((iVar34 * 4) / 10 <= p1 || (!borg_simulate)))) {
        if (iVar34 * 3 < p1) {
          wVar15 = L'(';
        }
        else if (iVar34 * 2 < p1) {
          wVar15 = L'-';
        }
        else {
          wVar15 = (uint)((iVar34 * 5) / 2 < p1) * 5 + L'2';
        }
        _Var6 = borg_spell_okay_fail(TELEPORT_OTHER,wVar15);
        if ((((_Var6) || (_Var6 = borg_equips_item(act_tele_other,true), _Var6)) ||
            ((wVar15 = borg_slot(L'\x17',sv_wand_teleport_away), pbVar5 = borg_items,
             wVar15 != L'\xffffffff' &&
             (wVar15 = borg_slot(L'\x17',sv_wand_teleport_away), pbVar5[wVar15].pval != 0)))) &&
           ((_Var6 = borg_surrounded(), !_Var6 &&
            ((borg_kills_cnt != 0 || (borg_simulate == false)))))) {
          borg_temp_n = 0;
          borg_tp_other_n = 0;
          lVar41 = 0x1d8;
          iVar11 = borg_kills_nxt;
          for (lVar40 = 1; pbVar4 = borg_kills, lVar40 < iVar11; lVar40 = lVar40 + 1) {
            if ((*(short *)(borg_kills->spell + lVar41 + -0x19) != 0) &&
               (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar41))) {
              if (((~borg_grids[*(int *)(borg_kills->spell + lVar41 + -9)]
                     [*(int *)(borg_kills->spell + lVar41 + -0xd)].info & 0x28) == 0) &&
                 ((6 < (byte)(borg_grids[*(int *)(borg_kills->spell + lVar41 + -9)]
                              [*(int *)(borg_kills->spell + lVar41 + -0xd)].feat - 0x10) &&
                  (grid1_07.y = borg.c.y, grid1_07.x = borg.c.x,
                  wVar15 = distance(grid1_07,*(loc_conflict *)(borg_kills->spell + lVar41 + -0xd)),
                  iVar11 = borg_kills_nxt, wVar15 <= (int)(uint)z_info->max_range)))) {
                borg_temp_x[borg_temp_n] = pbVar4->spell[lVar41 + -0xd];
                borg_temp_y[borg_temp_n] = pbVar4->spell[lVar41 + -9];
                borg_temp_n = borg_temp_n + 1;
              }
            }
            lVar41 = lVar41 + 0x1d8;
          }
          if ((borg_temp_n == 0) && (borg_simulate != false)) {
            return L'\0';
          }
          _Var6 = false;
          wVar15 = borg_launch_bolt(L'\0',p1,L'-',(uint)z_info->max_range,L'\0');
          if (wVar15 < L'\x01') {
            return L'\0';
          }
          if (borg_simulate == true) {
            if (avoidance / 2 < wVar15) {
              borg_tp_other_n = 0;
              borg_temp_n = 0;
              return wVar15;
            }
            borg_tp_other_n = 0;
            borg_temp_n = 0;
            return L'\0';
          }
          borg_log_spellpath(_Var6);
          for (lVar40 = 0; lVar40 < borg_tp_other_n; lVar40 = lVar40 + 1) {
            pcVar23 = format("# T.O. %d, index %d (%d,%d)",(long)borg_tp_other_n,
                             (ulong)(uint)borg_tp_other_index[lVar40],(ulong)borg_tp_other_y[lVar40]
                             ,(ulong)borg_tp_other_x[lVar40]);
            borg_note(pcVar23);
          }
          borg_temp_n = 0;
          borg_tp_other_n = 0;
          goto LAB_00203af2;
        }
      }
    }
    break;
  case L'\f':
    if (((!borg.temp.hero) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) {
      if (borg.trait[0x79] != 0) {
        return L'\0';
      }
      _Var6 = borg_spell_okay_fail(HEROISM,L'\x0f');
      bVar42 = false;
      if (_Var6) {
        wVar15 = borg.trait[0x23];
        wVar21 = borg_heroism_level();
        bVar42 = wVar21 <= wVar15;
      }
      wVar15 = borg_slot(L'\x1a',sv_potion_heroism);
      if (wVar15 == L'\xffffffff' && !bVar42) {
        return L'\0';
      }
      if (p1 <= avoidance / 10) {
        return L'\0';
      }
      if ((int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10 <= p1) {
        return L'\0';
      }
      if (borg_simulate != false) {
        return L'\x01';
      }
      borg_note("# Attempting to cast Hero");
      if ((bVar42) && (_Var6 = borg_spell(HEROISM), _Var6)) {
        borg.no_rest_prep = 10000;
        return L'\x01';
      }
      _Var6 = borg_quaff_potion(sv_potion_heroism);
LAB_0020006a:
      if (_Var6 != false) {
        borg.no_rest_prep = 10000;
        return L'\x01';
      }
      return L'\0';
    }
    break;
  case L'\r':
    if ((((((!borg.temp.berserk) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
         (borg.trait[0x79] == 0)) &&
        (((_Var6 = borg_spell_okay_fail(BERSERK_STRENGTH,L'\x0f'), _Var6 ||
          (wVar15 = borg_slot(L'\x1a',sv_potion_berserk), wVar15 != L'\xffffffff')) ||
         ((_Var6 = borg_equips_item(act_berserker,true), _Var6 ||
          ((_Var6 = borg_equips_item(act_rage_bless_resist,true), _Var6 ||
           (_Var6 = borg_equips_item(act_shero,true), _Var6)))))))) &&
       ((avoidance / 10 < p1 &&
        (p1 < (int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10)))) {
      if (borg_simulate != false) {
        return L'\x05';
      }
      _Var6 = borg_spell(BERSERK_STRENGTH);
      if (_Var6) {
        return L'\x05';
      }
      _Var6 = borg_activate_item(act_berserker);
      if (_Var6) {
        return L'\x05';
      }
      _Var6 = borg_activate_item(act_rage_bless_resist);
      if (_Var6) {
        return L'\x05';
      }
      _Var6 = borg_activate_item(act_shero);
      if (_Var6) {
        return L'\x05';
      }
      _Var6 = borg_quaff_potion(sv_potion_berserk);
      wVar18 = wVar14;
LAB_00200938:
      if (_Var6 != false) {
        return wVar18;
      }
    }
    break;
  case L'\x0e':
    if (((!borg.temp.smite_evil) && (borg.trait[0xc2] == 0)) &&
       ((borg.trait[0x70] == 0 &&
        (((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)) &&
         (_Var6 = borg_spell_okay_fail(SMITE_EVIL,L'\x0f'), _Var6)))))) {
      lVar41 = 0x1d8;
      for (lVar40 = 1; pbVar4 = borg_kills, lVar40 < borg_kills_nxt; lVar40 = lVar40 + 1) {
        if (((*(ushort *)(borg_kills->spell + lVar41 + -0x19) != 0) &&
            ((int)(uint)*(ushort *)(borg_kills->spell + lVar41 + -0x19) < (int)(z_info->r_max - 1)))
           && (((borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar41) &&
                (((borg_grids[*(int *)(borg_kills->spell + lVar41 + -9)]
                   [*(int *)(borg_kills->spell + lVar41 + -0xd)].info & 8) != 0 &&
                 (grid1_00.y = borg.c.y, grid1_00.x = borg.c.x,
                 wVar15 = distance(grid1_00,*(loc_conflict *)(borg_kills->spell + lVar41 + -0xd)),
                 wVar15 < L'\x04')))) &&
               (_Var6 = flag_has_dbg(r_info[*(ushort *)(pbVar4->spell + lVar41 + -0x19)].flags,0xb,
                                     0x3d,"(r_info[kill->r_idx].flags)","RF_EVIL"), _Var6)))) {
          if ((avoidance / 10 < p1) &&
             (p1 < (int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10)) {
            if (borg_simulate != false) {
              return L'\x05';
            }
            _Var6 = borg_spell(SMITE_EVIL);
            wVar18 = wVar14;
            goto LAB_00200938;
          }
          break;
        }
        lVar41 = lVar41 + 0x1d8;
      }
    }
    break;
  case L'\x0f':
    if ((((!borg.temp.regen) && (borg.trait[0x70] == 0)) &&
        ((borg.trait[0x72] == 0 &&
         (((borg.trait[0x79] == 0 && (99 < borg.trait[0x1c])) &&
          (_Var6 = borg_spell_okay_fail(RAPID_REGENERATION,L'\x0f'), _Var6)))))) &&
       ((avoidance / 10 < p1 &&
        (p1 < (int)(((uint)(borg_fighting_unique != L'\0') * 2 + 5) * (int)avoidance) / 10)))) {
      if (borg_simulate != false) {
        return L'\x01';
      }
      _Var6 = borg_spell(RAPID_REGENERATION);
      goto LAB_0020006a;
    }
    break;
  case L'\x10':
    if ((((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
         ((pbVar39 = borg_grids[borg.c.y] + borg.c.x, pbVar39->take == '\0' &&
          (pbVar39->trap == false)))) && (3 < (byte)(pbVar39->feat - 3))) &&
       (borg_fighting_unique < L'\n')) {
      if (avoidance < p1) {
        wVar15 = L'\x06';
      }
      else if ((avoidance * 2) / 3 < p1) {
        wVar15 = L'\x14';
      }
      else {
        wVar15 = L'\x19';
        if (p1 < avoidance / 3) {
          wVar15 = L'-';
        }
      }
      _Var6 = borg_spell_okay_fail(GLYPH_OF_WARDING,wVar15);
      wVar21 = borg_slot(L'\x19',sv_scroll_rune_of_protection);
      _Var7 = borg_equips_item(act_glyph,true);
      if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)) {
        if ((pbVar39->info & 2) == 0) {
          if (borg.trait[0x1a] == 0 || (!_Var7 && !_Var6) && wVar21 < L'\0') {
            return L'\0';
          }
        }
        else if ((!_Var7 && !_Var6) && wVar21 < L'\0') {
          return L'\0';
        }
        borg_on_glyph = true;
        wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
        borg_on_glyph = false;
        wVar18 = p1 - wVar21;
        if (wVar18 == L'\0' || p1 < wVar21) {
          borg_on_glyph = false;
          return L'\0';
        }
        if (borg_fighting_unique == L'\0') {
          wVar19 = (wchar_t)(avoidance / 2);
        }
        else {
          wVar19 = (avoidance * 2) / 3;
        }
        if (wVar19 < wVar21) {
          borg_on_glyph = false;
          return L'\0';
        }
        if (p1 <= avoidance / 7) {
          borg_on_glyph = false;
          return L'\0';
        }
        if (borg_simulate != true) {
          _Var6 = borg_spell_fail(GLYPH_OF_WARDING,wVar15);
          if (((!_Var6) && (_Var6 = borg_read_scroll(sv_scroll_rune_of_protection), !_Var6)) &&
             (_Var6 = borg_activate_item(act_glyph), !_Var6)) {
            return L'\0';
          }
          uVar22 = 0;
          uVar12 = track_glyph.num;
          uVar36 = uVar12;
          if ((short)uVar12 < 1) {
            uVar36 = 0;
          }
          while( true ) {
            if (uVar36 == uVar22) {
              if ((short)uVar12 < track_glyph.size) {
                borg_note("# Noting the creation of a glyph.");
                iVar11 = track_glyph.num;
                lVar40 = (long)track_glyph.num;
                track_glyph.x[lVar40] = borg.c.x;
                track_glyph.y[lVar40] = borg.c.y;
                track_glyph.num = iVar11 + 1;
                return wVar18;
              }
              return wVar18;
            }
            if ((track_glyph.x[uVar22] == borg.c.x) && (track_glyph.y[uVar22] == borg.c.y)) break;
            uVar22 = uVar22 + 1;
          }
          return wVar18;
        }
        borg_on_glyph = false;
        return wVar18;
      }
    }
    break;
  case L'\x11':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) &&
       ((borg.trait[0x79] == 0 && (borg_fighting_summoner)))) {
      wVar15 = L'\v';
      if (((p1 <= avoidance) && (wVar15 = L'\x19', p1 <= (avoidance * 2) / 3)) &&
         (wVar15 = L'\x1e', p1 < avoidance / 3)) {
        wVar15 = L'2';
      }
      _Var6 = borg_spell_okay_fail(DOOR_CREATION,wVar15);
      if (!_Var6) {
        return L'\0';
      }
      iVar34 = 0;
      for (lVar40 = -1; lVar41 = -1, lVar40 != 2; lVar40 = lVar40 + 1) {
        for (; lVar41 != 2; lVar41 = lVar41 + 1) {
          pbVar39 = borg_grids[borg.c.y + lVar41] + lVar40 + borg.c.x;
          if (((borg_grids[borg.c.y + lVar41][lVar40 + borg.c.x].glyph != false) ||
              (pbVar39->kill != '\0')) ||
             ((pbVar39->feat < 0x17 && ((0x600004U >> (pbVar39->feat & 0x1f) & 1) != 0)))) {
            iVar34 = iVar34 + 1;
          }
          if (((pbVar39->take != '\0') || (pbVar39->trap != false)) ||
             (((byte)(pbVar39->feat - 3) < 4 || (pbVar39->kill != '\0')))) {
            iVar34 = iVar34 + 1;
          }
        }
      }
      if (iVar34 < 6) {
        borg_create_door = true;
        wVar21 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
        borg_create_door = false;
        wVar18 = p1 - wVar21;
        if (wVar18 == L'\0' || p1 < wVar21) {
          borg_create_door = false;
          return L'\0';
        }
        if (borg_fighting_unique == L'\0') {
          wVar19 = (wchar_t)(avoidance / 2);
        }
        else {
          wVar19 = (avoidance * 2) / 3;
        }
        if (wVar19 < wVar21) {
          borg_create_door = false;
          return L'\0';
        }
        if (p1 <= avoidance / 7) {
          borg_create_door = false;
          return L'\0';
        }
        if (borg_simulate != true) {
          _Var6 = borg_spell_fail(DOOR_CREATION,wVar15);
          if (_Var6) {
            borg_needs_new_sea = true;
            breeder_level = true;
            return wVar18;
          }
          return L'\0';
        }
        borg_create_door = false;
        return wVar18;
      }
    }
    break;
  case L'\x12':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) &&
       ((borg.trait[0x79] == 0 &&
        (((_Var6 = borg_spell_okay_fail(MASS_BANISHMENT,L'('), _Var6 ||
          (_Var6 = borg_equips_item(act_banishment,true), _Var6)) || (borg.trait[0xf9] != 0)))))) {
      if ((p1 < (avoidance * 0xc) / 10) && (borg_simulate != false)) {
        return L'\0';
      }
      local_c58 = 0;
      lVar41 = 0x1e4;
      iVar34 = 0;
      for (lVar40 = 1; pmVar3 = r_info, lVar40 < borg_kills_nxt; lVar40 = lVar40 + 1) {
        uVar36 = *(ushort *)(borg_kills->spell + lVar41 + -0x25);
        if ((((ulong)uVar36 != 0) && ((int)(uint)uVar36 < (int)(z_info->r_max - 1))) &&
           ((grid1_03.y = borg.c.y, grid1_03.x = borg.c.x,
            wVar15 = distance(grid1_03,*(loc_conflict *)(borg_kills->spell + lVar41 + -0x19)),
            wVar15 < L'\x15' &&
            (_Var6 = flag_has_dbg(pmVar3[uVar36].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var6))))
        {
          wVar15 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar40,true,true);
          local_c58 = local_c58 + wVar15;
          iVar34 = iVar34 + 3;
        }
        lVar41 = lVar41 + 0x1d8;
      }
      if ((iVar34 * 0xc) / 10 < borg.trait[0x1b]) {
        iVar13 = p1 - local_c58;
        if (p1 - local_c58 < 1) {
          iVar13 = 0;
        }
        wVar15 = iVar13 + iVar34;
        if (0x1a < iVar34 && L'\t' < borg_fighting_unique) {
          wVar15 = (uint)(wVar15 * 6) / 10;
        }
        wVar21 = p1 - wVar15;
        if (wVar21 == L'\0' || p1 < wVar15) {
          return L'\0';
        }
        if (borg_fighting_unique == L'\0') {
          wVar18 = (wchar_t)(avoidance / 2);
        }
        else {
          wVar18 = (avoidance * 2) / 3;
        }
        if (wVar18 < wVar15) {
          return L'\0';
        }
        if (borg_simulate == true) {
          return wVar21;
        }
        _Var6 = borg_read_scroll(sv_scroll_mass_banishment);
        if (((!_Var6) && (_Var6 = borg_activate_item(act_banishment), !_Var6)) &&
           (_Var6 = borg_spell(MASS_BANISHMENT), !_Var6)) {
          return L'\0';
        }
        lVar41 = 0x1d8;
        for (lVar40 = 1; lVar40 < borg_kills_nxt; lVar40 = lVar40 + 1) {
          uVar36 = *(ushort *)(borg_kills->spell + lVar41 + -0x19);
          if (((uVar36 != 0) && ((int)(uint)uVar36 < (int)(z_info->r_max - 1))) &&
             (_Var6 = flag_has_dbg(r_info[(uint)uVar36].flags,0xb,1,"tmp_r_ptr->flags","RF_UNIQUE"),
             !_Var6)) {
            borg_delete_kill((wchar_t)lVar40);
          }
          lVar41 = lVar41 + 0x1d8;
        }
        return wVar21;
      }
    }
    break;
  case L'\x13':
    if (((p1 <= avoidance) && (wVar21 = L'\x0f', p1 <= (avoidance * 2) / 3)) &&
       (wVar21 = L'\x19', p1 < avoidance / 3)) {
      wVar21 = wVar19;
    }
    if (borg.trait[0x70] != 0) {
      return L'\0';
    }
    if (borg.trait[0x72] != 0) {
      return L'\0';
    }
    if (borg.trait[0x79] == 0) {
      uVar36 = borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb];
      uVar12 = borg_fear_monsters[borg.c.y][borg.c.x];
      _Var6 = borg_spell_okay_fail(BANISHMENT,wVar21);
      if (((!_Var6) && (_Var6 = borg_equips_item(act_banishment,true), !_Var6)) &&
         ((_Var6 = borg_equips_staff_fail(sv_staff_banishment), !_Var6 &&
          (wVar15 = borg_slot(L'\x19',sv_scroll_banishment), wVar15 == L'\xffffffff')))) {
        return L'\0';
      }
      if (borg.trait[0x1b] < 0x4c) {
        return L'\0';
      }
      iVar34 = p1 - ((uint)uVar36 + (uint)uVar12);
      for (lVar40 = 0; lVar40 != 0xff; lVar40 = lVar40 + 1) {
        b_danger[lVar40] = L'\0';
        b_kill_count[lVar40] = L'\0';
        awStack_c38[lVar40] = L'\0';
      }
      iVar13 = 0;
      lVar41 = 0x1e8;
      wVar15 = L'\x01';
      for (lVar40 = 1; pbVar4 = borg_kills, pmVar3 = r_info, lVar40 < borg_kills_nxt;
          lVar40 = lVar40 + 1) {
        uVar22 = (ulong)*(ushort *)(borg_kills->spell + lVar41 + -0x29);
        if (((uVar22 != 0) &&
            ((int)(uint)*(ushort *)(borg_kills->spell + lVar41 + -0x29) < (int)(z_info->r_max - 1)))
           && (_Var6 = flag_has_dbg(r_info[uVar22].flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var6))
        {
          wVar21 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar40,true,true);
          wVar18 = borg_danger_one_kill
                             (*(wchar_t *)(pbVar4->spell + lVar41 + -0x19),
                              *(wchar_t *)(pbVar4->spell + lVar41 + -0x1d),L'\x01',(wchar_t)lVar40,
                              true,true);
          bVar33 = (byte)pmVar3[uVar22].d_char;
          b_danger[bVar33] = b_danger[bVar33] + wVar21;
          awStack_c38[bVar33] = awStack_c38[bVar33] + wVar18;
          iVar13 = iVar13 + wVar21;
          b_kill_count[bVar33] = b_kill_count[bVar33] + L'\x01';
        }
        lVar41 = lVar41 + 0x1d8;
      }
      uVar32 = 0;
      uVar30 = 0;
      iVar20 = 0;
      uVar22 = 0;
      while( true ) {
        uVar28 = (uint)(uVar32 & 0xff);
        uVar24 = uVar22 & 0xff;
        if (uVar30 == 0xff) break;
        if (b_kill_count[uVar30] != L'\0') {
          wVar21 = b_danger[uVar30];
          uVar22 = uVar24;
          if (wVar15 < wVar21) {
            uVar22 = uVar30 & 0xffffffff;
            iVar20 = iVar13 - wVar21;
            wVar15 = wVar21;
          }
          if (wVar15 < awStack_c38[uVar30]) {
            uVar28 = (uint)uVar30;
            wVar15 = awStack_c38[uVar30];
          }
          uVar32 = (ulong)uVar28;
          if (borg_simulate == false) {
            pcVar23 = format("# Race \'%c\' is a threat with total danger %d from %d individuals.",
                             uVar30 & 0xffffffff);
            borg_note(pcVar23);
          }
        }
        uVar30 = uVar30 + 1;
      }
      uVar38 = 0;
      uVar30 = uVar38;
      if ((char)uVar32 != '\0') {
        uVar32 = uVar32 & 0xff;
        if (borg.trait[0x1b] < 0x177) {
          uVar32 = uVar38;
        }
        if (awStack_c38[uVar32] < borg.trait[0x1c] * 3) {
          uVar32 = uVar38;
        }
        uVar28 = 0;
        if ((b_kill_count[uVar32] * 0x30) / 10 < borg.trait[0x1b]) {
          uVar28 = (uint)uVar32;
        }
        uVar30 = 0;
        if ((((char)uVar28 != '\0') && (iVar34 <= avoidance / 5)) &&
           (uVar35 = (ulong)uVar28, uVar30 = uVar38, b_kill_count[uVar35] < L'K')) {
          pcVar23 = format("# Race \'%c\' is a real threat with total danger %d from %d individuals."
                           ,uVar35,(ulong)(uint)awStack_c38[uVar35]);
          borg_note(pcVar23);
          uVar30 = uVar32;
        }
      }
      cVar37 = (char)uVar30;
      if ((char)uVar22 == '\0') {
        uVar24 = 0;
        cVar27 = cVar37;
      }
      else {
        if (borg.trait[0x1b] <= (b_kill_count[uVar24] * 0x30) / 10) {
          uVar24 = 0;
        }
        if ((iVar34 < (avoidance * 7) / 10) ||
           ((0x4b < borg.trait[0x69] && (iVar34 < (avoidance * 6) / 10)))) {
          uVar24 = 0;
        }
        if (iVar20 <= avoidance / 2) {
          uVar24 = 0;
        }
        cVar27 = (char)uVar24;
        if ((char)uVar24 == '\0') {
          cVar27 = cVar37;
        }
      }
      if (cVar27 != '\0') {
        cVar10 = (char)uVar24;
        bVar42 = cVar10 == '\0';
        wVar15 = (wchar_t)cVar27;
        if (borg_simulate == true) {
          if (cVar10 != '\0') {
            return iVar34 - iVar20;
          }
          if (cVar37 != '\0') {
            return awStack_c38[uVar30];
          }
          bVar2 = true;
          bVar42 = true;
        }
        else {
          if (cVar10 != '\0') {
            pcVar23 = format("# Banishing race \'%c\' (qty:%d).  Danger after spell:%d",
                             (ulong)(uint)wVar15,(ulong)(uint)b_kill_count[uVar24],iVar20);
            borg_note(pcVar23);
          }
          if (cVar37 == '\0') {
            bVar2 = true;
          }
          else {
            uVar22 = (ulong)(uint)((int)uVar30 * 4);
            bVar2 = false;
            pcVar23 = format("# Banishing race \'%c\' (qty:%d).  Danger from them:%d",
                             (ulong)(uint)wVar15,(ulong)*(uint *)((long)b_kill_count + uVar22),
                             (ulong)*(uint *)((long)awStack_c38 + uVar22));
            borg_note(pcVar23);
          }
        }
        _Var6 = borg_read_scroll(sv_scroll_banishment);
        if ((((_Var6) || (_Var6 = borg_spell(BANISHMENT), _Var6)) ||
            (_Var6 = borg_activate_item(act_banishment), _Var6)) ||
           (_Var6 = borg_use_staff(sv_staff_banishment), _Var6)) {
          borg_keypress(wVar15);
          lVar41 = 0x1d8;
          for (lVar40 = 1; lVar40 < borg_kills_nxt; lVar40 = lVar40 + 1) {
            if ((r_info[*(ushort *)(borg_kills->spell + lVar41 + -0x19)].d_char == wVar15) &&
               (_Var6 = flag_has_dbg(r_info[*(ushort *)(borg_kills->spell + lVar41 + -0x19)].flags,
                                     0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var6)) {
              borg_delete_kill((wchar_t)lVar40);
            }
            lVar41 = lVar41 + 0x1d8;
          }
        }
        if (!bVar42) {
          return iVar34 - iVar20;
        }
        if (!bVar2) {
          return awStack_c38[uVar30];
        }
        return L'\0';
      }
      return L'\0';
    }
    return L'\0';
  case L'\x14':
    if (((((0xf9 < borg.trait[0x1b]) && ((borg.trait[0x1c] * 7) / 10 <= borg.trait[0x1b])) &&
         (0x18 < borg.trait[0x69])) && ((borg.trait[0x70] == 0 && (borg.trait[0x72] == 0)))) &&
       ((borg.trait[0x79] == 0 && (p1 <= avoidance / 4)))) {
      _Var6 = borg_spell_okay_fail(BANISHMENT,L'#');
      if (((!_Var6) && (_Var6 = borg_equips_item(act_banishment,true), !_Var6)) &&
         (_Var6 = borg_equips_staff_fail(sv_staff_banishment), !_Var6)) {
        return L'\0';
      }
      uVar22 = 0xffffffffffffffff;
      for (uVar30 = 0; borg_nasties_num != uVar30; uVar30 = uVar30 + 1) {
        if (borg_nasties_limit[uVar30] <= borg_nasties_count[uVar30]) {
          uVar22 = uVar30;
        }
        uVar22 = uVar22 & 0xffffffff;
      }
      iVar34 = (int)uVar22;
      if (iVar34 != -1) {
        if (borg_simulate != false) {
          return L'\n';
        }
        pcVar23 = format("# Banishing nasties \'%c\' (qty:%d).",
                         (ulong)(uint)(int)borg_nasties[iVar34],(ulong)borg_nasties_count[iVar34]);
        borg_note(pcVar23);
        _Var6 = borg_activate_item(act_banishment);
        if (((_Var6) || (_Var6 = borg_use_staff(sv_staff_banishment), _Var6)) ||
           (_Var6 = borg_spell(BANISHMENT), _Var6)) {
          borg_keypress((int)borg_nasties[iVar34]);
          borg_nasties_count[iVar34] = '\0';
          lVar41 = 0x1d8;
          iVar11 = borg_kills_nxt;
          for (lVar40 = 1; lVar40 < iVar11; lVar40 = lVar40 + 1) {
            if (r_info[*(ushort *)(borg_kills->spell + lVar41 + -0x19)].d_char ==
                (int)borg_nasties[iVar34]) {
              borg_delete_kill((wchar_t)lVar40);
              iVar11 = borg_kills_nxt;
            }
            lVar41 = lVar41 + 0x1d8;
          }
          return L'\n';
        }
      }
    }
    break;
  case L'\x15':
    if (!borg_simulate) {
      borg_needs_new_sea = true;
      _Var6 = borg_spell(TREMOR);
      if (_Var6) {
        borg_keypress(0x2a);
        borg_keypress(0x35);
      }
      else {
        _Var6 = borg_spell(QUAKE);
        if (_Var6) {
          return L'✏';
        }
        _Var6 = borg_spell(GRONDS_BLOW);
        if (_Var6) {
          return L'✏';
        }
        _Var6 = borg_activate_item(act_earthquakes);
        if (_Var6) {
          return L'✏';
        }
      }
    }
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
       (((_Var6 = borg_spell_okay_fail(TREMOR,L'#'), _Var6 ||
         (_Var6 = borg_spell_okay_fail(QUAKE,L'#'), _Var6)) ||
        ((_Var6 = borg_spell_okay_fail(GRONDS_BLOW,L'#'), _Var6 ||
         (_Var6 = borg_equips_item(act_earthquakes,true), _Var6)))))) {
      if ((p1 < (avoidance * 6) / 10) && (borg_fighting_summoner != true)) {
        return L'\0';
      }
      lVar40 = 0xc;
      iVar34 = 0;
      for (lVar41 = 0; pbVar4 = borg_kills, lVar41 < borg_kills_nxt; lVar41 = lVar41 + 1) {
        _Var6 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(borg_kills->spell + lVar40 + -0x15),
                         *(wchar_t *)(borg_kills->spell + lVar40 + -0x19));
        if ((_Var6) && (pbVar4->spell[lVar40 + -0xd] != '\0')) {
          grid2.y = borg.c.y;
          grid2.x = borg.c.x;
          wVar15 = distance(*(loc_conflict *)(pbVar4->spell + lVar40 + -0x19),grid2);
          iVar34 = iVar34 + (uint)(L'\x01' < wVar15);
        }
        lVar40 = lVar40 + 0x1d8;
      }
      if (iVar34 < 4) {
        wVar15 = L'✏';
        if ((iVar34 == 3) && ((avoidance * 7) / 10 < p1)) {
          wVar15 = (p1 * 6) / 10;
        }
      }
      else {
        wVar15 = L'✏';
        if ((avoidance * 7) / 10 < p1) {
          wVar15 = p1 / 3;
        }
      }
      if (p1 - wVar15 == L'\0' || p1 < wVar15) {
        return L'\0';
      }
      if (borg_fighting_unique == L'\0') {
        wVar21 = (wchar_t)(avoidance / 2);
      }
      else {
        wVar21 = (avoidance * 2) / 3;
      }
      if (wVar21 < wVar15) {
        return L'\0';
      }
      if (p1 <= avoidance / 5) {
        return L'\0';
      }
      if (borg_simulate != false) {
        return p1 - wVar15;
      }
      return L'\0';
    }
    break;
  case L'\x16':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      if (!borg_simulate) {
        _Var6 = borg_spell(WORD_OF_DESTRUCTION);
        if (_Var6) {
          borg_needs_new_sea = true;
          return L'Ǵ';
        }
        _Var6 = borg_use_staff(sv_staff_destruction);
        if (_Var6) {
          borg_needs_new_sea = true;
          return L'Ǵ';
        }
        _Var6 = borg_activate_item(act_destruction2);
        if (_Var6) {
          borg_needs_new_sea = true;
          return L'Ǵ';
        }
        return L'Ǵ';
      }
      if (!borg_morgoth_position) {
        wVar15 = (wchar_t)avoidance;
        if (((wVar15 * 8) / 10 < p1) && (0x59 < borg.trait[0x69])) {
          if ((wVar15 < p1) || (borg.trait[0x1b] < 0x12d)) {
LAB_00202515:
            if ((((borg.trait[0xd3] == 0) && (borg.trait[0xf7] == 0)) ||
                (((L'\x04' < borg_fighting_unique || (borg.trait[0x1b] < 0x113)) ||
                 (_Var6 = borg_caution_teleport(L'K',L'\x02'), !_Var6)))) &&
               (((borg.trait[0xd4] < 2 || (borg.trait[0x1b] < 0x113)) ||
                (_Var6 = borg_caution_teleport(L'K',L'\x02'), !_Var6)))) {
              _Var6 = borg_spell_okay_fail(WORD_OF_DESTRUCTION,L'7');
              if (((_Var6) || (_Var6 = borg_equips_staff_fail(sv_staff_destruction), _Var6)) ||
                 (_Var6 = borg_equips_item(act_destruction2,true), _Var6)) {
                bVar33 = 1;
              }
              else {
                bVar33 = 0;
              }
              wVar15 = (wchar_t)avoidance;
              if ((wVar15 * 4 < p1) || ((wVar15 < p1 && (borg.trait[0x1b] < 0x97)))) {
                _Var6 = borg_equips_staff_fail(sv_staff_destruction);
                if ((bVar33 | _Var6) != 1) {
                  return L'\0';
                }
                wVar15 = (wchar_t)avoidance;
              }
              else if (bVar33 == 0) {
                return L'\0';
              }
              wVar21 = p1;
              if (p1 < wVar15 * 2) {
                wVar21 = L'\0';
              }
              if (L'\x02' < borg_fighting_unique) {
                wVar21 = p1;
              }
              if (L'\t' < borg_fighting_unique) {
                wVar21 = L'\0';
              }
              if (borg_simulate == false) {
                return L'\0';
              }
              return wVar21;
            }
          }
        }
        else if (wVar15 < p1) goto LAB_00202515;
      }
    }
    break;
  case L'\x17':
    if ((!borg_simulate) && (_Var6 = borg_spell(TELEPORT_LEVEL), _Var6)) {
      borg_needs_new_sea = true;
      return L'Ǵ';
    }
    if (((((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) &&
          (avoidance * 2 <= p1)) &&
         (((borg.trait[0xd3] == 0 && (borg.trait[0xf7] == 0)) ||
          (_Var6 = borg_caution_teleport(L'A',L'\x02'), !_Var6)))) &&
        ((borg.trait[0xd4] < 2 || (_Var6 = borg_caution_teleport(L'A',L'\x02'), !_Var6)))) &&
       ((_Var6 = borg_spell_okay_fail(TELEPORT_LEVEL,L'7'), _Var6 && (morgoth_on_level == false))))
    {
      if ((L'\0' < borg_fighting_unique) && (borg_as_position != false)) {
        return L'\0';
      }
      if (borg_simulate != false) {
        return p1;
      }
      return L'\0';
    }
    break;
  case L'\x18':
    if (avoidance / 10 <= p1) {
      wVar15 = L'\x0f';
      if ((int)avoidance << 2 < p1) {
        wVar15 = wVar14;
      }
      if ((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) {
        if (borg.trait[0x79] != 0) {
          return L'\0';
        }
        _Var6 = borg_equips_item(act_loskill,true);
        if ((!_Var6) || (bVar42 = true, borg.has[0x1b] < 0x65)) {
          _Var6 = borg_spell_okay_fail(BANISH_EVIL,wVar15);
          bVar42 = false;
          if (!_Var6) {
            return L'\0';
          }
        }
        lVar41 = 0x1e8;
        iVar34 = 1;
        for (lVar40 = 1; uVar22 = (ulong)borg_kills_nxt, lVar40 < (long)uVar22; lVar40 = lVar40 + 1)
        {
          if ((*(short *)(borg_kills->spell + lVar41 + -0x29) != 0) &&
             (_Var6 = borg_projectable(borg.c.y,borg.c.x,
                                       *(wchar_t *)(borg_kills->spell + lVar41 + -0x19),
                                       *(wchar_t *)(borg_kills->spell + lVar41 + -0x1d)), _Var6)) {
            wVar15 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar40,true,true);
            iVar34 = iVar34 + wVar15;
          }
          lVar41 = lVar41 + 0x1d8;
        }
        lVar40 = 1;
        lVar41 = 0x1d8;
        local_c3c = 0;
        local_c50 = iVar34;
        do {
          pbVar4 = borg_kills;
          pmVar3 = r_info;
          if ((short)uVar22 <= lVar40) {
            if ((borg_simulate == false) &&
               (((bVar42 && (_Var6 = borg_activate_item(act_loskill), _Var6)) ||
                (_Var6 = borg_spell(BANISH_EVIL), _Var6)))) {
              return iVar34 - local_c50;
            }
            if (local_c50 < 1) {
              local_c50 = 0;
            }
            iVar13 = 9999;
            if (local_c3c != 0) {
              iVar13 = local_c50;
            }
            if ((L'\t' < borg_fighting_unique) && (0xfa < borg.trait[0x1b])) {
              if (borg.trait[0x69] == 99) {
                iVar13 = 9999;
              }
              if ((0x15e < (uint)borg.trait[0x1b]) && (borg.trait[0x69] == 100)) {
                iVar13 = 9999;
              }
            }
            if (iVar34 - iVar13 != L'\0' && iVar13 <= iVar34) {
              if (borg_fighting_unique == L'\0') {
                iVar20 = (int)(avoidance / 2);
              }
              else {
                iVar20 = (avoidance * 2) / 3;
              }
              if (iVar13 <= iVar20) {
                if (borg_simulate != false) {
                  return iVar34 - iVar13;
                }
                return L'\0';
              }
              return L'\0';
            }
            return L'\0';
          }
          uVar36 = *(ushort *)(borg_kills->spell + lVar41 + -0x19);
          if (((ulong)uVar36 != 0) && ((int)(uint)uVar36 < (int)(z_info->r_max - 1))) {
            wVar15 = *(wchar_t *)(borg_kills->spell + lVar41 + -0xd);
            pbVar39 = borg_grids[*(wchar_t *)(borg_kills->spell + lVar41 + -9)];
            _Var6 = borg_projectable(borg.c.y,borg.c.x,*(wchar_t *)(borg_kills->spell + lVar41 + -9)
                                     ,wVar15);
            if (_Var6) {
              if (borg_simulate == false) {
                uVar1 = *(undefined4 *)(pbVar4->spell + lVar41 + -0xd);
                uVar28 = *(uint *)(pbVar4->spell + lVar41 + -9);
                pcVar23 = borg_race_name((uint)*(ushort *)(pbVar4->spell + lVar41 + -0x19));
                wVar21 = borg_danger_one_kill
                                   (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,true,false)
                ;
                pcVar23 = format("# Banishing Evil: (%d,%d): %s, danger %d. is considered.",
                                 (ulong)uVar28,uVar1,pcVar23,(ulong)(uint)wVar21);
                borg_note(pcVar23);
              }
              _Var6 = flag_has_dbg(pmVar3[uVar36].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
              if (_Var6) {
                _Var6 = flag_has_dbg(pmVar3[uVar36].flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
                if ((_Var6) && (0x3c < *(short *)((long)pbVar4->spell_flags + lVar41 + -8))) {
                  if (borg_simulate == false) {
                    uVar1 = *(undefined4 *)(pbVar4->spell + lVar41 + -0xd);
                    uVar28 = *(uint *)(pbVar4->spell + lVar41 + -9);
                    pcVar23 = borg_race_name((uint)*(ushort *)(pbVar4->spell + lVar41 + -0x19));
                    wVar15 = borg_danger_one_kill
                                       (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,true,
                                        false);
                    pcVar23 = format("# Banishing Evil: (%d,%d): %s, danger %d. Unique not considered: Injury %d."
                                     ,(ulong)uVar28,uVar1,pcVar23,(ulong)(uint)wVar15);
                    goto LAB_00201fcc;
                  }
                }
                else {
                  _Var6 = borg_cave_floor_bold
                                    (*(wchar_t *)(pbVar4->spell + lVar41 + -9),
                                     *(wchar_t *)(pbVar4->spell + lVar41 + -0xd));
                  if (_Var6) {
                    if (borg_simulate == false) {
                      uVar1 = *(undefined4 *)(pbVar4->spell + lVar41 + -0xd);
                      uVar28 = *(uint *)(pbVar4->spell + lVar41 + -9);
                      pcVar23 = borg_race_name((uint)*(ushort *)(pbVar4->spell + lVar41 + -0x19));
                      wVar15 = borg_danger_one_kill
                                         (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,true,
                                          true);
                      pcVar23 = format("# Banishing Evil: (%d,%d): %s, danger %d. Booted.",
                                       (ulong)uVar28,uVar1,pcVar23,(ulong)(uint)wVar15);
                      borg_note(pcVar23);
                      borg_delete_kill((wchar_t)lVar40);
                    }
                    local_c3c = local_c3c + 1;
                    wVar15 = borg_danger_one_kill
                                       (borg.c.y,borg.c.x,L'\x01',(wchar_t)lVar40,true,true);
                    local_c50 = local_c50 - wVar15;
                  }
                  else if (borg_simulate == false) {
                    uVar1 = *(undefined4 *)(pbVar4->spell + lVar41 + -0xd);
                    local_c58 = *(uint *)(pbVar4->spell + lVar41 + -9);
                    pcVar23 = borg_race_name((uint)*(ushort *)(pbVar4->spell + lVar41 + -0x19));
                    wVar15 = borg_danger_one_kill
                                       (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,true,
                                        true);
                    fmt = "# Banishing Evil: (%d,%d): %s, danger %d. Stays (in wall).";
                    goto LAB_00201fb7;
                  }
                }
              }
              else if (borg_simulate == false) {
                uVar1 = *(undefined4 *)(pbVar4->spell + lVar41 + -0xd);
                local_c58 = *(uint *)(pbVar4->spell + lVar41 + -9);
                pcVar23 = borg_race_name((uint)*(ushort *)(pbVar4->spell + lVar41 + -0x19));
                wVar15 = borg_danger_one_kill
                                   (borg.c.y,borg.c.x,L'\x01',(uint)pbVar39[wVar15].kill,true,false)
                ;
                fmt = "# Banishing Evil: (%d,%d): %s, danger %d. Stays (not evil).";
LAB_00201fb7:
                pcVar23 = format(fmt,(ulong)local_c58,uVar1,pcVar23,(ulong)(uint)wVar15);
LAB_00201fcc:
                borg_note(pcVar23);
              }
            }
          }
          lVar40 = lVar40 + 1;
          uVar22 = (ulong)(ushort)borg_kills_nxt;
          lVar41 = lVar41 + 0x1d8;
        } while( true );
      }
    }
    break;
  case L'\x19':
    if (((borg.trait[0x79] == 0) && (borg.trait[0x70] == 0)) &&
       (((borg.trait[0x72] == 0 && ((borg.see_inv == 0 && ((int)borg_t <= borg.need_see_invis + 5)))
         ) && (p1 <= avoidance * 2)))) {
      pbVar39 = borg_grids[borg.c.y];
      lVar40 = (long)borg.c.x;
      wVar15 = borg_slot(L'\x1a',sv_potion_detect_invis);
      if (((((((wVar15 != L'\xffffffff') ||
              (wVar15 = borg_slot(L'\x19',sv_scroll_detect_invis), wVar15 != L'\xffffffff')) ||
             (_Var6 = borg_equips_staff_fail(sv_staff_detect_invis), _Var6)) ||
            ((_Var6 = borg_equips_staff_fail(sv_staff_detect_evil), _Var6 ||
             (_Var6 = borg_spell_okay_fail(SENSE_INVISIBLE,L'\x19'), _Var6)))) ||
           (_Var6 = borg_spell_okay_fail(DETECTION,L'\x19'), _Var6)) ||
          (((_Var6 = borg_equips_item(act_detect_invis,true), _Var6 ||
            (_Var6 = borg_equips_item(act_tmd_sinvis,true), _Var6)) ||
           ((_Var6 = borg_equips_item(act_tmd_esp,true), _Var6 ||
            (_Var6 = borg_equips_item(act_detect_evil,true), _Var6)))))) &&
         (((pbVar39[lVar40].info & 2) != 0 || (borg.trait[0x1a] != 0)))) {
        if (borg_simulate != false) {
          return L'\n';
        }
        _Var6 = borg_spell_fail(REVEAL_MONSTERS,L'\x19');
        if ((((_Var6) || (_Var6 = borg_read_scroll(sv_scroll_detect_invis), _Var6)) ||
            (_Var6 = borg_use_staff(sv_staff_detect_invis), _Var6)) ||
           (((_Var6 = borg_use_staff(sv_staff_detect_evil), _Var6 ||
             (_Var6 = borg_activate_item(act_detect_invis), _Var6)) ||
            ((_Var6 = borg_activate_item(act_tmd_sinvis), _Var6 ||
             ((_Var6 = borg_activate_item(act_tmd_esp), _Var6 ||
              (_Var6 = borg_activate_item(act_detect_evil), _Var6)))))))) {
          borg.see_inv = 3000;
          return L'\n';
        }
        _Var6 = borg_quaff_potion(sv_potion_detect_invis);
        if (_Var6) {
          borg.see_inv = 18000;
          borg.no_rest_prep = 18000;
          return L'\n';
        }
        _Var6 = borg_spell_fail(SENSE_INVISIBLE,L'\x19');
        if (_Var6) {
          borg.see_inv = 30000;
          borg.no_rest_prep = 16000;
          return L'\n';
        }
        return L'\0';
      }
    }
    break;
  case L'\x1a':
    if (((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x79] == 0)) {
      if (borg.need_see_invis + 2 < (int)borg_t) {
        return L'\0';
      }
      wVar15 = borg.c.y + L'\xffffffff';
      _Var6 = borg_cave_floor_bold(wVar15,borg.c.x);
      if (_Var6) {
        wVar21 = iVar13 + L'\x01';
        _Var6 = borg_cave_floor_bold(wVar21,iVar34);
        if (!_Var6) goto LAB_002013f6;
        wVar18 = iVar34 + L'\xffffffff';
        _Var6 = borg_cave_floor_bold(iVar13,wVar18);
        if (_Var6) goto LAB_002013f6;
        wVar19 = iVar34 + L'\x01';
        _Var6 = borg_cave_floor_bold(iVar13,wVar19);
        if (((_Var6) || (_Var6 = borg_cave_floor_bold(wVar21,wVar18), _Var6)) ||
           ((_Var6 = borg_cave_floor_bold(wVar21,wVar19), _Var6 ||
            (_Var6 = borg_cave_floor_bold(wVar15,wVar18), _Var6)))) goto LAB_002013f6;
        _Var6 = borg_cave_floor_bold(wVar15,wVar19);
        bVar42 = !_Var6;
      }
      else {
LAB_002013f6:
        bVar42 = false;
      }
      wVar21 = iVar34 + L'\xffffffff';
      _Var6 = borg_cave_floor_bold(iVar13,wVar21);
      if (_Var6) {
        wVar18 = iVar34 + L'\x01';
        _Var6 = borg_cave_floor_bold(iVar13,wVar18);
        if ((_Var6) && (_Var6 = borg_cave_floor_bold(wVar15,iVar34), !_Var6)) {
          wVar19 = iVar13 + L'\x01';
          _Var6 = borg_cave_floor_bold(wVar19,iVar34);
          if ((!_Var6) &&
             (((_Var6 = borg_cave_floor_bold(wVar19,wVar21), !_Var6 &&
               (_Var6 = borg_cave_floor_bold(wVar19,wVar18), !_Var6)) &&
              (_Var6 = borg_cave_floor_bold(wVar15,wVar21), !_Var6)))) {
            _Var6 = borg_cave_floor_bold(wVar15,wVar18);
            bVar42 = (bool)(!_Var6 | bVar42);
          }
        }
      }
      _Var6 = borg_cave_floor_bold(wVar15,iVar34);
      if (((_Var6) && (_Var6 = borg_cave_floor_bold(iVar13 + L'\x01',iVar34), _Var6)) &&
         (_Var6 = borg_cave_floor_bold(iVar13,wVar21), !_Var6)) {
        _Var6 = borg_cave_floor_bold(iVar13,iVar34 + L'\x01');
        bVar42 = (bool)(!_Var6 | bVar42);
      }
      _Var6 = borg_cave_floor_bold(iVar13,wVar21);
      if (((!_Var6) || (_Var6 = borg_cave_floor_bold(iVar13,iVar34 + L'\x01'), !_Var6)) ||
         (_Var6 = borg_cave_floor_bold(wVar15,iVar34), _Var6)) {
        if (bVar42) goto LAB_002014f4;
      }
      else {
        _Var6 = borg_cave_floor_bold(iVar13 + L'\x01',iVar34);
        if ((~_Var6 & 1U) != 0 || bVar42) {
LAB_002014f4:
          if (((borg_simulate != true) || (p1 <= (avoidance * 3) / 4)) &&
             (_Var6 = borg_light_beam(true), _Var6)) {
            if (borg_simulate != false) {
              return L'\n';
            }
            _Var6 = borg_light_beam(false);
            if (!_Var6) {
              return L'\0';
            }
            return L'\n';
          }
        }
      }
    }
    break;
  case L'\x1b':
    iVar34 = Term->offset_x;
    wVar15 = borg_panel_wid();
    iVar34 = iVar34 / wVar15;
    iVar13 = Term->offset_y;
    wVar15 = borg_panel_hgt();
    iVar13 = iVar13 / wVar15;
    if ((0x45 < borg.trait[0x69] | borg.need_shift_panel) == 1) {
      if (((borg.trait[0x69] == 100) && (w_y == morgy_panel_y)) && (w_x == morgy_panel_x)) {
        return L'\0';
      }
      uVar16 = 0;
      if (iVar34 == 0) {
        uVar16 = uVar28;
      }
      if (8 < borg.c.x - 0x34U) {
        uVar16 = 0;
      }
      uVar17 = uVar16;
      if (iVar34 == 1) {
        uVar17 = uVar28;
      }
      if (10 < borg.c.x - 0x54U) {
        uVar17 = uVar16;
      }
      uVar29 = 2;
      uVar16 = uVar17;
      if (iVar34 == 2) {
        uVar16 = uVar28;
      }
      uVar31 = 8;
      if (7 < borg.c.x - 0x74U) {
        uVar16 = uVar17;
      }
      uVar17 = uVar16;
      if (iVar34 == 3) {
        uVar17 = uVar28;
      }
      if (0xb < borg.c.x - 0x94U) {
        uVar17 = uVar16;
      }
      uVar16 = 4;
      uVar28 = uVar17;
      if (iVar34 == 4) {
        uVar28 = 4;
      }
      if (6 < borg.c.x - 0x88U) {
        uVar28 = uVar17;
      }
      uVar17 = uVar28;
      if (iVar34 == 3) {
        uVar17 = uVar16;
      }
      if (7 < borg.c.x - 0x67U) {
        uVar17 = uVar28;
      }
      uVar28 = uVar17;
      if (iVar34 == 2) {
        uVar28 = uVar16;
      }
      if (8 < borg.c.x - 0x46U) {
        uVar28 = uVar17;
      }
      uVar17 = uVar28;
      if (iVar34 == 1) {
        uVar17 = uVar16;
      }
      if (9 < borg.c.x - 0x25U) {
        uVar17 = uVar28;
      }
      uVar28 = uVar17;
      if (iVar13 == 0) {
        uVar28 = uVar29;
      }
      if (4 < borg.c.y - 0xfU) {
        uVar28 = uVar17;
      }
      uVar16 = uVar28;
      if (iVar13 == 1) {
        uVar16 = uVar29;
      }
      if (5 < borg.c.y - 0x19U) {
        uVar16 = uVar28;
      }
      uVar28 = uVar16;
      if (iVar13 == 2) {
        uVar28 = 2;
      }
      if (5 < borg.c.y - 0x24U) {
        uVar28 = uVar16;
      }
      uVar16 = uVar28;
      if (iVar13 == 3) {
        uVar16 = uVar29;
      }
      if (4 < borg.c.y - 0x30U) {
        uVar16 = uVar28;
      }
      uVar28 = uVar16;
      if (iVar13 == 4) {
        uVar28 = uVar31;
      }
      if (4 < borg.c.y - 0x2fU) {
        uVar28 = uVar16;
      }
      uVar16 = uVar28;
      if (iVar13 == 3) {
        uVar16 = uVar31;
      }
      if (4 < borg.c.y - 0x23U) {
        uVar16 = uVar28;
      }
      uVar28 = uVar16;
      if (iVar13 == 2) {
        uVar28 = uVar31;
      }
      if (4 < borg.c.y - 0x18U) {
        uVar28 = uVar16;
      }
      if (iVar13 != 1) {
        uVar31 = uVar28;
      }
      if (4 < borg.c.y - 0xdU) {
        uVar31 = uVar28;
      }
      if (borg.need_shift_panel == false) {
        if (borg.when_shift_panel == 0) {
          if (track_step.num == 0) break;
        }
        else {
          if ((int)borg_t - (int)borg.when_shift_panel < 0xb) {
            return L'\0';
          }
          if ((int)borg_t - (int)borg_t_morgoth < 0xb) {
            return L'\0';
          }
          if (track_step.num == 0) {
            return L'\0';
          }
        }
        switch(uVar31) {
        case 2:
          _Var6 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y + L'\x02',borg.c.x);
          if (!_Var6) {
            return L'\0';
          }
          if (track_step.y[(long)track_step.num + -1] == borg.c.y + 1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x32;
          break;
        case 4:
          _Var6 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y,borg.c.x + L'\xfffffffe');
          if (!_Var6) {
            return L'\0';
          }
          if (track_step.x[(long)track_step.num + -1] == borg.c.x + -1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x34;
          break;
        case 6:
          _Var6 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y,borg.c.x + L'\x02');
          if (!_Var6) {
            return L'\0';
          }
          if (track_step.x[(long)track_step.num + -1] == borg.c.x + 1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x36;
          break;
        case 8:
          _Var6 = borg_projectable_pure(borg.c.y,borg.c.x,borg.c.y + L'\xfffffffe',borg.c.x);
          if (!_Var6) {
            return L'\0';
          }
          if (track_step.y[(long)track_step.num + -1] == borg.c.y + -1) {
            return L'\0';
          }
          borg_keypress(0x4c);
          k = 0x38;
          break;
        default:
          goto switchD_00201791_default;
        }
        borg_keypress(k);
        borg_note("# Shifted panel as a precaution.");
        borg.when_shift_panel = borg_t;
      }
      else {
        borg_keypress(0x4c);
        if (uVar31 != 0) {
          borg_keypress(uVar31 | 0x30);
        }
        borg_keypress(0xe000);
        borg_note("# Shifted panel to locate offscreen monster.");
        borg.need_shift_panel = false;
      }
      borg_keypress(0xe000);
    }
    break;
  case L'\x1c':
    if (((borg_morgoth_position) || ((borg_as_position && (borg_t - borg_t_antisummon < 0x32)))) &&
       (((morgoth_on_level || ((borg_as_position && (borg_t - borg_t_antisummon < 0x32)))) &&
        ((borg.trait[0x69] != 0 && (_Var6 = borg_spell_okay_fail(TELEPORT_OTHER,L'\x1e'), !_Var6))))
       )) {
      lVar40 = 1;
      lVar41 = 0x1d8;
      iVar11 = borg_kills_nxt;
      do {
        pbVar4 = borg_kills;
        if (iVar11 <= lVar40) {
          if (borg_simulate == false) {
            borg_keypress(0x2c);
            pcVar23 = format("# Resting on grid (%d, %d), waiting for Morgoth.",
                             (ulong)(uint)borg.c.y,(ulong)(uint)borg.c.x);
            borg_note(pcVar23);
            return L'È';
          }
          return L'È';
        }
        if (*(short *)(borg_kills->spell + lVar41 + -0x19) != 0) {
          uVar16 = *(wchar_t *)(borg_kills->spell + lVar41 + -0xd) - borg.c.x;
          uVar28 = -uVar16;
          if (0 < (int)uVar16) {
            uVar28 = uVar16;
          }
          uVar17 = *(wchar_t *)(borg_kills->spell + lVar41 + -9) - borg.c.y;
          uVar16 = -uVar17;
          if (0 < (int)uVar17) {
            uVar16 = uVar17;
          }
          if (uVar16 < uVar28) {
            uVar16 = uVar28;
          }
          if ((((uVar16 <= z_info->max_range) &&
               (_Var6 = borg_los(borg.c.y,borg.c.x,*(wchar_t *)(borg_kills->spell + lVar41 + -9),
                                 *(wchar_t *)(borg_kills->spell + lVar41 + -0xd)),
               iVar11 = borg_kills_nxt, _Var6)) &&
              ((borg_morgoth_id == *(ushort *)(pbVar4->spell + lVar41 + -0x19) ||
               (pbVar4->spell[lVar41 + -1] != '\0')))) && ((int)avoidance <= borg.trait[0x1b])) {
            borg_note("# Not resting. I can see Morgoth or a shooter.");
            break;
          }
        }
        lVar40 = lVar40 + 1;
        lVar41 = lVar41 + 0x1d8;
      } while( true );
    }
    break;
  case L'\x1d':
    if ((((borg.trait[0x69] == 100) && (morgoth_on_level)) && (borg.trait[0x70] == 0)) &&
       (((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)) &&
        ((_Var6 = borg_spell_okay_fail(TELEPORT_OTHER,L'('), _Var6 &&
         ((9 < borg.trait[0xe6] && (_Var6 = borg_surrounded(), !_Var6)))))))) {
      if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
        return L'\0';
      }
      borg_temp_n = 0;
      borg_tp_other_n = 0;
      lVar40 = 0;
      for (lVar41 = 0; pbVar4 = borg_kills, lVar41 < borg_kills_nxt; lVar41 = lVar41 + 1) {
        if ((((*(short *)(borg_kills->spell + lVar40 + -0x19) != 0) &&
             (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar40))) &&
            ((~borg_grids[*(int *)(borg_kills->spell + lVar40 + -9)]
               [*(int *)(borg_kills->spell + lVar40 + -0xd)].info & 0x28) == 0)) &&
           ((grid1_06.y = borg.c.y, grid1_06.x = borg.c.x,
            wVar15 = distance(grid1_06,*(loc_conflict *)(borg_kills->spell + lVar40 + -0xd)),
            wVar15 <= (int)(uint)z_info->max_range &&
            (_Var6 = borg_projectable(borg.c.y,borg.c.x,*(wchar_t *)(pbVar4->spell + lVar40 + -9),
                                      *(wchar_t *)(pbVar4->spell + lVar40 + -0xd)), _Var6)))) {
          borg_temp_x[borg_temp_n] = pbVar4->spell[lVar40 + -0xd];
          borg_temp_y[borg_temp_n] = pbVar4->spell[lVar40 + -9];
          borg_temp_n = borg_temp_n + 1;
        }
        lVar40 = lVar40 + 0x1d8;
      }
      if ((borg_temp_n != 0) || (borg_simulate == false)) {
        _Var6 = false;
        wVar21 = borg_launch_bolt(L'\0',L'2',L'.',(uint)z_info->max_range,L'\0');
        wVar15 = L'Ϩ';
        if (wVar21 < L'Ϩ') {
          wVar15 = wVar21;
        }
        borg_temp_n = 0;
        borg_tp_other_n = 0;
        if (borg_simulate != false) {
          borg_tp_other_n = 0;
          borg_temp_n = 0;
          return wVar15;
        }
        borg_log_spellpath(_Var6);
        for (lVar40 = 0; lVar40 < borg_tp_other_n; lVar40 = lVar40 + 1) {
          pcVar23 = format("# %d, index %d (%d,%d)",(long)borg_tp_other_n,
                           (ulong)(uint)borg_tp_other_index[lVar40],(ulong)borg_tp_other_y[lVar40],
                           (ulong)borg_tp_other_x[lVar40]);
          borg_note(pcVar23);
        }
        borg_note("# Attempting to cast T.O. for depth 100.");
LAB_00203af2:
        _Var6 = borg_spell(TELEPORT_OTHER);
        if (((_Var6) || (_Var6 = borg_activate_item(act_tele_other), _Var6)) ||
           (_Var6 = borg_aim_wand(sv_wand_teleport_away), _Var6)) {
          borg_keypress(0x35);
          successful_target = L'\xffffffff';
          return wVar15;
        }
      }
    }
    break;
  case L'\x1e':
    if ((((morgoth_on_level) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (borg.trait[0x79] == 0)) {
      _Var6 = borg_spell_okay_fail(BANISH_EVIL,L'2');
      _Var7 = borg_spell_okay_fail(MASS_BANISHMENT,L'2');
      if (_Var7 || _Var6) {
        if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
          return L'\0';
        }
        local_c60 = 0;
        lVar41 = 0x1d8;
        for (lVar40 = 1; pbVar4 = borg_kills, lVar40 < borg_kills_nxt; lVar40 = lVar40 + 1) {
          uVar36 = *(ushort *)(borg_kills->spell + lVar41 + -0x19);
          if (((uVar36 != 0) && ((int)(uint)uVar36 < (int)(z_info->r_max - 1))) &&
             ((borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar41) &&
              ((((_Var7 || !_Var6 ||
                 (_Var8 = flag_has_dbg(r_info[(uint)uVar36].flags,0xb,0x3d,"r_ptr->flags","RF_EVIL")
                 , _Var8)) &&
                (grid1_04.y = borg.c.y, grid1_04.x = borg.c.x,
                wVar15 = distance(grid1_04,*(loc_conflict *)(pbVar4->spell + lVar41 + -0xd)),
                wVar15 <= (int)(uint)z_info->max_range)) &&
               (_Var8 = borg_projectable(borg.c.y,borg.c.x,*(wchar_t *)(pbVar4->spell + lVar41 + -9)
                                         ,*(wchar_t *)(pbVar4->spell + lVar41 + -0xd)), _Var8))))))
          {
            grid1_05.y = borg.c.y;
            grid1_05.x = borg.c.x;
            wVar15 = distance(grid1_05,*(loc_conflict *)(pbVar4->spell + lVar41 + -0xd));
            local_c60 = (ulong)((int)local_c60 + (uint)(wVar15 < L'\b') + 1);
          }
          lVar41 = lVar41 + 0x1d8;
        }
        wVar15 = L'ל';
        if ((int)local_c60 < 8) {
          wVar15 = L'\0';
        }
        if ((borg_simulate & 1U) == 0) {
          pcVar23 = format("# Attempting to cast Banishment for depth 100.  %d monsters ",local_c60)
          ;
          borg_note(pcVar23);
          _Var6 = borg_spell(MASS_BANISHMENT);
          if ((!_Var6) && (_Var6 = borg_spell(BANISH_EVIL), !_Var6)) {
            return L'\0';
          }
          lVar40 = 0;
          for (lVar41 = 0; lVar41 < borg_kills_nxt; lVar41 = lVar41 + 1) {
            uVar36 = *(ushort *)(borg_kills->spell + lVar40 + -0x19);
            if (((uVar36 != 0) && ((int)(uint)uVar36 < (int)(z_info->r_max - 1))) &&
               (_Var6 = flag_has_dbg(r_info[(uint)uVar36].flags,0xb,1,"tmp_r_ptr->flags","RF_UNIQUE"
                                    ), !_Var6)) {
              borg_delete_kill((wchar_t)lVar41);
            }
            lVar40 = lVar40 + 0x1d8;
          }
          return L'Ϩ';
        }
        return wVar15;
      }
    }
    break;
  case L'\x1f':
    if (((((borg_morgoth_position) && (morgoth_on_level)) && (borg.trait[0x70] == 0)) &&
        ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))) &&
       ((_Var6 = borg_spell_okay_fail(SPEAR_OF_LIGHT,L'2'), _Var6 ||
        ((_Var6 = borg_spell_okay_fail(CLAIRVOYANCE,L'2'), _Var6 ||
         (_Var6 = borg_spell_okay_fail(FUME_OF_MORDOR,L'2'), _Var6)))))) {
      if ((borg_kills_cnt == 0) && (borg_simulate != false)) {
        return L'\0';
      }
      iVar34 = 0;
      lVar41 = 0x1d8;
      for (lVar40 = 1; pbVar4 = borg_kills, lVar40 < borg_kills_nxt; lVar40 = lVar40 + 1) {
        if (((*(ushort *)(borg_kills->spell + lVar41 + -0x19) != 0) &&
            (borg_morgoth_id == *(ushort *)(borg_kills->spell + lVar41 + -0x19))) &&
           (borg_t + -2 <= (int)*(short *)((long)&borg_kills->when + lVar41))) {
          wVar18 = *(wchar_t *)(borg_kills->spell + lVar41 + -0xd);
          wVar19 = *(wchar_t *)(borg_kills->spell + lVar41 + -9);
          grid1_01.y = borg.c.y;
          grid1_01.x = borg.c.x;
          wVar14 = distance(grid1_01,*(loc_conflict *)(borg_kills->spell + lVar41 + -0xd));
          if (((wVar14 <= (int)(uint)z_info->max_range) &&
              (grid1_02.y = borg.c.y, grid1_02.x = borg.c.x,
              wVar14 = distance(grid1_02,*(loc_conflict *)(pbVar4->spell + lVar41 + -0xd)),
              L'\x05' < wVar14)) &&
             (_Var6 = borg_projectable_dark(borg.c.y,borg.c.x,wVar19,wVar18), _Var6)) {
            iVar34 = iVar34 + 1;
            wVar21 = wVar19;
            wVar15 = wVar18;
          }
        }
        lVar41 = lVar41 + 0x1d8;
      }
      wVar18 = L'Ǵ';
      if (iVar34 < 1) {
        wVar18 = L'\0';
      }
      if ((borg_simulate & 1U) != 0) {
        return wVar18;
      }
      pcVar23 = format("# Attempting to Illuminate a Pathway to (%d, %d)",(ulong)(uint)wVar21,
                       (ulong)(uint)wVar15);
      borg_note(pcVar23);
      t.y = wVar21;
      t.x = wVar15;
      borg_target(t);
      _Var6 = borg_spell(SPEAR_OF_LIGHT);
      if (((_Var6) || (_Var6 = borg_spell(CLAIRVOYANCE), _Var6)) ||
         (_Var6 = borg_spell(FUME_OF_MORDOR), _Var6)) {
        borg_keypress(0x35);
        return L'È';
      }
    }
  }
switchD_00201791_default:
  return L'\0';
}

Assistant:

static int borg_calculate_defense_effectiveness(int what, int p1)
{
    /* Analyze */
    switch (what) {
    case BD_SPEED: {
        return (borg_defend_aux_speed(p1));
    }
    case BD_PROT_FROM_EVIL: {
        return (borg_defend_aux_prot_evil(p1));
    }
    case BD_GRIM_PURPOSE: {
        return (borg_defend_aux_grim_purpose(p1));
    }
    case BD_RESIST_FECAP: {
        return (borg_defend_aux_resist_fecap(p1));
    }
    case BD_RESIST_F: {
        return (borg_defend_aux_resist_f(p1));
    }
    case BD_RESIST_C: {
        return (borg_defend_aux_resist_c(p1));
    }
    case BD_RESIST_A: {
        return (borg_defend_aux_resist_a(p1));
    }
    case BD_RESIST_E: {
        return (borg_defend_aux_resist_e(p1));
    }
    case BD_RESIST_P: {
        return (borg_defend_aux_resist_p(p1));
    }
    case BD_BLESS: {
        return (borg_defend_aux_bless(p1));
    }
    case BD_HERO: {
        return (borg_defend_aux_hero(p1));
    }
    case BD_BERSERK: {
        return (borg_defend_aux_berserk(p1));
    }
    case BD_SMITE_EVIL: {
        return (borg_defend_aux_smite_evil(p1));
    }
    case BD_REGEN: {
        return (borg_defend_aux_regen(p1));
    }
    case BD_SHIELD: {
        return (borg_defend_aux_shield(p1));
    }
    case BD_TELE_AWAY: {
        return (borg_defend_aux_tele_away(p1));
    }
    case BD_GLYPH: {
        return (borg_defend_aux_glyph(p1));
    }
    case BD_CREATE_DOOR: {
        return (borg_defend_aux_create_door(p1));
    }
    case BD_MASS_GENOCIDE: {
        return (borg_defend_aux_mass_genocide(p1));
    }
    case BD_GENOCIDE: {
        return (borg_defend_aux_genocide(p1));
    }
    case BD_GENOCIDE_NASTIES: {
        return (borg_defend_aux_genocide_nasties(p1));
    }
    case BD_EARTHQUAKE: {
        return (borg_defend_aux_earthquake(p1));
    }
    case BD_TPORTLEVEL: {
        return (borg_defend_aux_teleportlevel(p1));
    }
    case BD_DESTRUCTION: {
        return (borg_defend_aux_destruction(p1));
    }
    case BD_BANISHMENT: {
        return (borg_defend_aux_banishment(p1));
    }
    case BD_DETECT_INVISO: {
        return (borg_defend_aux_inviso(p1));
    }
    case BD_LIGHT_BEAM: {
        return (borg_defend_aux_lbeam(p1));
    }
    case BD_SHIFT_PANEL: {
        return (borg_defend_aux_panel_shift());
    }
    case BD_REST: {
        return (borg_defend_aux_rest());
    }
    case BD_TELE_AWAY_MORGOTH: {
        return (borg_defend_aux_tele_away_morgoth());
    }
    case BD_BANISHMENT_MORGOTH: {
        return (borg_defend_aux_banishment_morgoth());
    }
    case BD_LIGHT_MORGOTH: {
        return (borg_defend_aux_light_morgoth());
    }
    }
    return 0;
}